

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

bool anon_unknown.dwarf_2087c::ScrollWhenDraggingOnVoid(ImVec2 *delta,ImGuiMouseButton mouse_button)

{
  uint uVar1;
  int in_ESI;
  float *in_RDI;
  ImGuiButtonFlags button_flags;
  bool dragging;
  bool held;
  bool hovered;
  ImGuiWindow *window;
  ImGuiContext *g;
  int local_3c;
  ImRect local_38;
  int local_28;
  byte local_23;
  bool local_22;
  bool local_21;
  ImGuiWindow *local_20;
  long local_18;
  int local_c;
  float *local_8;
  
  local_c = in_ESI;
  local_8 = in_RDI;
  local_18 = ImGui::GetCurrentContext();
  local_20 = *(ImGuiWindow **)(local_18 + 0x1a88);
  local_21 = false;
  local_22 = false;
  local_23 = 0;
  if (local_c == 0) {
    local_3c = 1;
  }
  else {
    local_3c = 4;
    if (local_c == 1) {
      local_3c = 2;
    }
  }
  local_28 = local_3c;
  if (*(int *)(local_18 + 0x1ac4) == 0) {
    local_38 = ImGuiWindow::Rect((ImGuiWindow *)0x17f051);
    uVar1 = ImGuiWindow::GetID((char *)local_20,"##scrolldraggingoverlay");
    ImGui::ButtonBehavior((ImRect *)&local_38,uVar1,&local_21,&local_22,local_28);
  }
  if (((local_22 & 1U) != 0) && ((*local_8 != 0.0 || (NAN(*local_8))))) {
    ImGui::SetScrollX(local_20,*(float *)(local_20 + 0x54) + *local_8);
  }
  if (((local_22 & 1U) != 0) && ((local_8[1] != 0.0 || (NAN(local_8[1]))))) {
    ImGui::SetScrollY(local_20,*(float *)(local_20 + 0x58) + local_8[1]);
    local_23 = 1;
  }
  return (bool)(local_23 & 1);
}

Assistant:

bool ScrollWhenDraggingOnVoid(const ImVec2& delta, ImGuiMouseButton mouse_button) {
    ImGuiContext& g = *ImGui::GetCurrentContext();
    ImGuiWindow* window = g.CurrentWindow;
    bool hovered = false;
    bool held = false;
    bool dragging = false;
    ImGuiButtonFlags button_flags = (mouse_button == 0) ? ImGuiButtonFlags_MouseButtonLeft : (mouse_button == 1) ? ImGuiButtonFlags_MouseButtonRight : ImGuiButtonFlags_MouseButtonMiddle;
    if (g.HoveredId == 0) // If nothing hovered so far in the frame (not same as IsAnyItemHovered()!)
        ImGui::ButtonBehavior(window->Rect(), window->GetID("##scrolldraggingoverlay"), &hovered, &held, button_flags);
    if (held && delta.x != 0.0f) {
        ImGui::SetScrollX(window, window->Scroll.x + delta.x);
    }
    if (held && delta.y != 0.0f) {
        ImGui::SetScrollY(window, window->Scroll.y + delta.y);
        dragging = true;
    }
    return dragging;
}